

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void __thiscall VBW::ConvexCell::kill_vertex(ConvexCell *this,index_t v)

{
  uint uVar1;
  uint uVar2;
  pointer pTVar3;
  ushort uVar4;
  ulong uVar5;
  uint uVar6;
  ushort uVar7;
  
  uVar1 = this->nb_t_;
  if ((ulong)uVar1 != 0) {
    pTVar3 = (this->t_).
             super_vector<VBW::TriangleWithFlags,_GEO::Memory::aligned_allocator<VBW::TriangleWithFlags,_64>_>
             .
             super__Vector_base<VBW::TriangleWithFlags,_GEO::Memory::aligned_allocator<VBW::TriangleWithFlags,_64>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      uVar2._0_2_ = pTVar3[uVar5].super_Triangle.i;
      uVar2._2_2_ = pTVar3[uVar5].super_Triangle.j;
      uVar7 = pTVar3[uVar5].super_Triangle.k;
      uVar6 = uVar2;
      if ((uVar2 & 0xffff) == v) {
        uVar6 = 0;
      }
      uVar4 = 0;
      if (((uint)(CONCAT24(uVar7,uVar2) >> 0x10) & 0xffff) != v) {
        uVar4 = uVar2._2_2_;
      }
      if (uVar7 == v) {
        uVar7 = 0;
      }
      pTVar3[uVar5].super_Triangle.i = (short)uVar6;
      pTVar3[uVar5].super_Triangle.j = uVar4;
      pTVar3[uVar5].super_Triangle.k = uVar7;
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  return;
}

Assistant:

void ConvexCell::kill_vertex(index_t v) {
	for(index_t t=0; t<nb_t(); ++t) {
	    Triangle T = get_triangle(t);
	    if(T.i == v) {
		T.i = VERTEX_AT_INFINITY;
	    }
	    if(T.j == v) {
		T.j = VERTEX_AT_INFINITY;
	    }
	    if(T.k == v) {
		T.k = VERTEX_AT_INFINITY;
	    }
	    t_[t].i = T.i;
	    t_[t].j = T.j;
	    t_[t].k = T.k;	    
	}
    }